

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseImport
          (Parser *this,
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dependency,RepeatedField<int> *public_dependency,RepeatedField<int> *weak_dependency,
          LocationRecorder *root_location,FileDescriptorProto *containing_file)

{
  int iVar1;
  Rep *pRVar2;
  Arena *this_00;
  bool bVar3;
  int iVar4;
  string *output;
  LocationRecorder location;
  LocationRecorder local_40;
  
  bVar3 = Consume(this,"import");
  if (!bVar3) {
    return false;
  }
  iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar4 == 0) {
    LocationRecorder::LocationRecorder(&local_40,root_location,10,public_dependency->current_size_);
    bVar3 = Consume(this,"public");
    if (!bVar3) {
LAB_002cf39a:
      LocationRecorder::~LocationRecorder(&local_40);
      return false;
    }
    iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    if (public_dependency->current_size_ == public_dependency->total_size_) {
      RepeatedField<int>::Reserve(public_dependency,public_dependency->total_size_ + 1);
    }
    iVar1 = public_dependency->current_size_;
    public_dependency->current_size_ = iVar1 + 1;
    public_dependency->rep_->elements[iVar1] = iVar4;
LAB_002cf351:
    LocationRecorder::~LocationRecorder(&local_40);
    if (bVar3 == false) {
      return false;
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 == 0) {
      LocationRecorder::LocationRecorder(&local_40,root_location,0xb,weak_dependency->current_size_)
      ;
      bVar3 = Consume(this,"weak");
      if (!bVar3) goto LAB_002cf39a;
      iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
      if (weak_dependency->current_size_ == weak_dependency->total_size_) {
        RepeatedField<int>::Reserve(weak_dependency,weak_dependency->total_size_ + 1);
      }
      iVar1 = weak_dependency->current_size_;
      weak_dependency->current_size_ = iVar1 + 1;
      weak_dependency->rep_->elements[iVar1] = iVar4;
      goto LAB_002cf351;
    }
  }
  LocationRecorder::LocationRecorder
            (&local_40,root_location,3,(dependency->super_RepeatedPtrFieldBase).current_size_);
  pRVar2 = (dependency->super_RepeatedPtrFieldBase).rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_002cf3b1:
    internal::RepeatedPtrFieldBase::Reserve
              (&dependency->super_RepeatedPtrFieldBase,
               (dependency->super_RepeatedPtrFieldBase).total_size_ + 1);
  }
  else {
    iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
    if (iVar4 < pRVar2->allocated_size) {
      (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar4 + 1;
      output = (string *)pRVar2->elements[iVar4];
      goto LAB_002cf441;
    }
    if (pRVar2->allocated_size == (dependency->super_RepeatedPtrFieldBase).total_size_)
    goto LAB_002cf3b1;
  }
  pRVar2 = (dependency->super_RepeatedPtrFieldBase).rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  this_00 = (dependency->super_RepeatedPtrFieldBase).arena_;
  if (this_00 == (Arena *)0x0) {
    output = (string *)operator_new(0x20);
    (output->_M_dataplus)._M_p = (pointer)&output->field_2;
    output->_M_string_length = 0;
    (output->field_2)._M_local_buf[0] = '\0';
  }
  else {
    output = (string *)
             Arena::AllocateAligned(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    (output->_M_dataplus)._M_p = (pointer)&output->field_2;
    output->_M_string_length = 0;
    (output->field_2)._M_local_buf[0] = '\0';
    Arena::AddListNode(this_00,output,internal::arena_destruct_object<std::__cxx11::string>);
  }
  iVar4 = (dependency->super_RepeatedPtrFieldBase).current_size_;
  (dependency->super_RepeatedPtrFieldBase).current_size_ = iVar4 + 1;
  ((dependency->super_RepeatedPtrFieldBase).rep_)->elements[iVar4] = output;
LAB_002cf441:
  bVar3 = ConsumeString(this,output,"Expected a string naming the file to import.");
  if (bVar3) {
    LocationRecorder::EndAt(&local_40,&this->input_->previous_);
    bVar3 = ConsumeEndOfDeclaration(this,";",&local_40);
  }
  else {
    bVar3 = false;
  }
  LocationRecorder::~LocationRecorder(&local_40);
  return bVar3;
}

Assistant:

bool Parser::ParseImport(RepeatedPtrField<string>* dependency,
                         RepeatedField<int32>* public_dependency,
                         RepeatedField<int32>* weak_dependency,
                         const LocationRecorder& root_location,
                         const FileDescriptorProto* containing_file) {
  DO(Consume("import"));
  if (LookingAt("public")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kPublicDependencyFieldNumber,
        public_dependency->size());
    DO(Consume("public"));
    *public_dependency->Add() = dependency->size();
  } else if (LookingAt("weak")) {
    LocationRecorder location(
        root_location, FileDescriptorProto::kWeakDependencyFieldNumber,
        weak_dependency->size());
    DO(Consume("weak"));
    *weak_dependency->Add() = dependency->size();
  }
  {
    LocationRecorder location(root_location,
                              FileDescriptorProto::kDependencyFieldNumber,
                              dependency->size());
    DO(ConsumeString(dependency->Add(),
      "Expected a string naming the file to import."));

    location.EndAt(input_->previous());

    DO(ConsumeEndOfDeclaration(";", &location));
  }
  return true;
}